

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int soft_f32_compare(float32 a,float32 b,_Bool is_quiet,float_status *s)

{
  _Bool _Var1;
  FloatParts FVar2;
  FloatParts FVar3;
  FloatParts pb;
  FloatParts pa;
  float_status *s_local;
  _Bool is_quiet_local;
  float32 b_local;
  float32 a_local;
  ulong local_80;
  ulong local_50;
  int local_28;
  FloatClass FStack_24;
  _Bool _Stack_23;
  int local_18;
  FloatClass FStack_14;
  _Bool _Stack_13;
  int local_c;
  
  FVar2 = float32_unpack_raw(a);
  FVar2 = sf_canonicalize(FVar2,&float32_params,s);
  local_50 = FVar2.frac;
  FVar3 = float32_unpack_raw(b);
  FVar3 = sf_canonicalize(FVar3,&float32_params,s);
  local_80 = FVar3.frac;
  FStack_14 = FVar2.cls;
  _Var1 = is_nan(FStack_14);
  FStack_24 = FVar3.cls;
  if ((_Var1) || (_Var1 = is_nan(FStack_24), _Var1)) {
    if (((!is_quiet) || (FStack_14 == float_class_snan)) || (FStack_24 == float_class_snan)) {
      s->float_exception_flags = s->float_exception_flags | 1;
    }
    local_c = 2;
  }
  else {
    _Stack_23 = FVar3.sign;
    if (FStack_14 == float_class_zero) {
      if (FStack_24 == float_class_zero) {
        local_c = 0;
      }
      else {
        local_c = -1;
        if (((undefined1  [16])FVar3 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_c = 1;
        }
      }
    }
    else {
      _Stack_13 = FVar2.sign;
      if (FStack_24 == float_class_zero) {
        local_c = 1;
        if (((undefined1  [16])FVar2 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_c = -1;
        }
      }
      else if (FStack_14 == float_class_inf) {
        if ((FStack_24 == float_class_inf) && ((_Stack_13 & 1U) == (_Stack_23 & 1U))) {
          local_c = 0;
        }
        else {
          local_c = 1;
          if (((undefined1  [16])FVar2 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0)
          {
            local_c = -1;
          }
        }
      }
      else if (FStack_24 == float_class_inf) {
        local_c = -1;
        if (((undefined1  [16])FVar3 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_c = 1;
        }
      }
      else if ((_Stack_13 & 1U) == (_Stack_23 & 1U)) {
        local_18 = FVar2.exp;
        local_28 = FVar3.exp;
        if (local_18 == local_28) {
          if (local_50 == local_80) {
            local_c = 0;
          }
          else if (((undefined1  [16])FVar2 & (undefined1  [16])0x10000000000) ==
                   (undefined1  [16])0x0) {
            local_c = -1;
            if (local_80 < local_50) {
              local_c = 1;
            }
          }
          else {
            local_c = 1;
            if (local_80 < local_50) {
              local_c = -1;
            }
          }
        }
        else if (((undefined1  [16])FVar2 & (undefined1  [16])0x10000000000) ==
                 (undefined1  [16])0x0) {
          local_c = -1;
          if (local_28 < local_18) {
            local_c = 1;
          }
        }
        else {
          local_c = 1;
          if (local_28 < local_18) {
            local_c = -1;
          }
        }
      }
      else {
        local_c = 1;
        if (((undefined1  [16])FVar2 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_c = -1;
        }
      }
    }
  }
  return local_c;
}

Assistant:

static int QEMU_FLATTEN
f32_compare(float32 xa, float32 xb, bool is_quiet, float_status *s)
{
    union_float32 ua, ub;

    ua.s = xa;
    ub.s = xb;

    if (QEMU_NO_HARDFLOAT) {
        goto soft;
    }

    float32_input_flush2(&ua.s, &ub.s, s);
    if (isgreaterequal(ua.h, ub.h)) {
        if (isgreater(ua.h, ub.h)) {
            return float_relation_greater;
        }
        return float_relation_equal;
    }
    if (likely(isless(ua.h, ub.h))) {
        return float_relation_less;
    }
    /* The only condition remaining is unordered.
     * Fall through to set flags.
     */
 soft:
    return soft_f32_compare(ua.s, ub.s, is_quiet, s);
}